

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O1

gdImagePtr gdImageCreateFromTgaPtr(int size,void *data)

{
  gdIOCtx *ctx;
  gdImagePtr pgVar1;
  
  ctx = gdNewDynamicCtxEx(size,data,0);
  if (ctx == (gdIOCtx *)0x0) {
    pgVar1 = (gdImagePtr)0x0;
  }
  else {
    pgVar1 = gdImageCreateFromTgaCtx(ctx);
    (*ctx->gd_free)(ctx);
  }
  return pgVar1;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromTgaPtr(int size, void *data)
{
	gdImagePtr im;
	gdIOCtx *in = gdNewDynamicCtxEx (size, data, 0);
	if (in == NULL) return NULL;
	im = gdImageCreateFromTgaCtx(in);
	in->gd_free(in);
	return im;
}